

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::CheckReturnSignature
          (TypeChecker *this,TypeVector *actual,TypeVector *expected,char *desc)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string local_78;
  string local_58;
  Enum local_34;
  char *local_30;
  char *desc_local;
  TypeVector *expected_local;
  TypeVector *actual_local;
  TypeChecker *this_local;
  Result result;
  
  local_30 = desc;
  desc_local = (char *)expected;
  expected_local = actual;
  actual_local = (TypeVector *)this;
  local_34 = (Enum)CheckTypes(this,actual,expected);
  this_local._4_4_ = (Result)local_34;
  bVar1 = Failed((Result)local_34);
  if (bVar1) {
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_58,(_anonymous_namespace_ *)desc_local,(TypeVector *)0x0,desc);
    uVar2 = std::__cxx11::string::c_str();
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)expected_local,(TypeVector *)0x0,desc);
    uVar3 = std::__cxx11::string::c_str();
    PrintError(this,"return signatures have inconsistent types: expected %s, got %s",uVar2,uVar3);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckReturnSignature(const TypeVector& actual,
                                         const TypeVector& expected,
                                         const char* desc) {
  Result result = CheckTypes(actual, expected);
  if (Failed(result)) {
    PrintError("return signatures have inconsistent types: expected %s, got %s",
               TypesToString(expected).c_str(), TypesToString(actual).c_str());
  }
  return result;
}